

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_read_tile_header
                   (opj_codec_t *p_codec,opj_stream_t *p_stream,OPJ_UINT32 *p_tile_index,
                   OPJ_UINT32 *p_data_size,OPJ_INT32 *p_tile_x0,OPJ_INT32 *p_tile_y0,
                   OPJ_INT32 *p_tile_x1,OPJ_INT32 *p_tile_y1,OPJ_UINT32 *p_nb_comps,
                   OPJ_BOOL *p_should_go_on)

{
  OPJ_BOOL OVar1;
  
  if ((((p_tile_index != (OPJ_UINT32 *)0x0) && (p_codec != (opj_codec_t *)0x0)) &&
      (p_stream != (opj_stream_t *)0x0)) &&
     ((p_data_size != (OPJ_UINT32 *)0x0 && (*(int *)(p_codec + 0x12) != 0)))) {
    OVar1 = (*(code *)p_codec[2])
                      (p_codec[0xb],p_tile_index,p_data_size,p_tile_x0,p_tile_y0,p_tile_x1,p_tile_y1
                       ,p_nb_comps,p_should_go_on,p_stream,p_codec + 0xc);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_read_tile_header(opj_codec_t *p_codec,
        opj_stream_t * p_stream,
        OPJ_UINT32 * p_tile_index,
        OPJ_UINT32 * p_data_size,
        OPJ_INT32 * p_tile_x0, OPJ_INT32 * p_tile_y0,
        OPJ_INT32 * p_tile_x1, OPJ_INT32 * p_tile_y1,
        OPJ_UINT32 * p_nb_comps,
        OPJ_BOOL * p_should_go_on)
{
    if (p_codec && p_stream && p_data_size && p_tile_index) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;
        opj_stream_private_t * l_stream = (opj_stream_private_t *) p_stream;

        if (! l_codec->is_decompressor) {
            return OPJ_FALSE;
        }

        return l_codec->m_codec_data.m_decompression.opj_read_tile_header(
                   l_codec->m_codec,
                   p_tile_index,
                   p_data_size,
                   p_tile_x0, p_tile_y0,
                   p_tile_x1, p_tile_y1,
                   p_nb_comps,
                   p_should_go_on,
                   l_stream,
                   &(l_codec->m_event_mgr));
    }
    return OPJ_FALSE;
}